

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void __thiscall
module_reverse_csv_actions::header_start(module_reverse_csv_actions *this,string *header)

{
  ostream *poVar1;
  string *header_local;
  module_reverse_csv_actions *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&this->module_);
  poVar1 = std::operator<<(poVar1,(string *)&s_csv_separator_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,(string *)header);
  std::operator<<(poVar1,(string *)&s_csv_separator_abi_cxx11_);
  this->first_header_ = true;
  return;
}

Assistant:

void header_start( std::string const & header )
    {
        std::cout << module_ << s_csv_separator << header << s_csv_separator;
        first_header_ = true;
    }